

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O0

void __thiscall
yamc::fair::detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_unlock_shared
          (shared_mutex_base<yamc::rwlock::PhaseFairness> *this)

{
  bool bVar1;
  shared_mutex_base<yamc::rwlock::PhaseFairness> *this_local;
  
  if ((this->queue_).next != &this->locked_) {
    __assert_fail("queue_.next == &locked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_shared_mutex.hpp"
                  ,0x157,
                  "void yamc::fair::detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_unlock_shared() [RwLockFairness = yamc::rwlock::PhaseFairness]"
                 );
  }
  bVar1 = false;
  if (((this->locked_).status & 3) == 3) {
    bVar1 = 3 < (this->locked_).status;
  }
  if (!bVar1) {
    __assert_fail("(locked_.status & node_status_mask) == 3 && locked_.status >= node_nthread_inc",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_shared_mutex.hpp"
                  ,0x158,
                  "void yamc::fair::detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::impl_unlock_shared() [RwLockFairness = yamc::rwlock::PhaseFairness]"
                 );
  }
  (this->locked_).status = (this->locked_).status - 4;
  if ((this->locked_).status < 4) {
    wq_pop_locknode(this);
    std::condition_variable::notify_all();
  }
  return;
}

Assistant:

void impl_unlock_shared()
  {
    YAMC_DEBUG_DUMPQ(">>unlock_shared", &locked_, -1);
    assert(queue_.next == &locked_);
    assert((locked_.status & node_status_mask) == 3 && locked_.status >= node_nthread_inc);
    locked_.status -= node_nthread_inc;
    if (locked_.status < node_nthread_inc) {
      // all current shared-locks was unlocked
      wq_pop_locknode();
      cv_.notify_all();
    }
    YAMC_DEBUG_DUMPQ("<<unlock_shared");
  }